

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int vdbePmaReaderNext(PmaReader *pReadr)

{
  IncrMerger *pIncr;
  i64 iVar1;
  int iVar2;
  void *p;
  u64 nRec;
  u64 local_30;
  sqlite3_file *local_28;
  i64 iStack_20;
  
  local_30 = 0;
  if (pReadr->iReadOff < pReadr->iEof) {
LAB_001366e6:
    iVar2 = vdbePmaReadVarint(pReadr,&local_30);
    if (iVar2 == 0) {
      pReadr->nKey = (int)local_30;
      iVar2 = vdbePmaReadBlob(pReadr,(int)local_30,&pReadr->aKey);
      return iVar2;
    }
  }
  else {
    pIncr = pReadr->pIncr;
    iVar2 = 0;
    if (pIncr != (IncrMerger *)0x0) {
      if (pIncr->bUseThread == 0) {
        iVar2 = vdbeIncrPopulate(pIncr);
        iVar1 = pIncr->aFile[1].iEof;
        pIncr->aFile[0].pFd = pIncr->aFile[1].pFd;
        pIncr->aFile[0].iEof = iVar1;
        if (pIncr->aFile[0].iEof == pIncr->iStartOff) {
          pIncr->bEof = 1;
        }
LAB_001367ae:
        if ((iVar2 == 0) && (iVar2 = 0, pIncr->bEof == 0)) {
          iVar2 = vdbePmaReaderSeek(pIncr->pTask,pReadr,pIncr->aFile,pIncr->iStartOff);
          if (iVar2 != 0) {
            return iVar2;
          }
          goto LAB_001366e6;
        }
      }
      else {
        iVar2 = vdbeSorterJoinThread(pIncr->pTask);
        if (iVar2 == 0) {
          local_28 = pIncr->aFile[0].pFd;
          iStack_20 = pIncr->aFile[0].iEof;
          iVar1 = pIncr->aFile[1].iEof;
          pIncr->aFile[0].pFd = pIncr->aFile[1].pFd;
          pIncr->aFile[0].iEof = iVar1;
          pIncr->aFile[1].pFd = local_28;
          pIncr->aFile[1].iEof = iStack_20;
          if (pIncr->aFile[0].iEof != pIncr->iStartOff) {
            iVar2 = vdbeSorterCreateThread(pIncr->pTask,vdbeIncrPopulateThread,pIncr);
            goto LAB_001367ae;
          }
          pIncr->bEof = 1;
          iVar2 = 0;
        }
      }
    }
    vdbePmaReaderClear(pReadr);
  }
  return iVar2;
}

Assistant:

static int vdbePmaReaderNext(PmaReader *pReadr){
  int rc = SQLITE_OK;             /* Return Code */
  u64 nRec = 0;                   /* Size of record in bytes */


  if( pReadr->iReadOff>=pReadr->iEof ){
    IncrMerger *pIncr = pReadr->pIncr;
    int bEof = 1;
    if( pIncr ){
      rc = vdbeIncrSwap(pIncr);
      if( rc==SQLITE_OK && pIncr->bEof==0 ){
        rc = vdbePmaReaderSeek(
            pIncr->pTask, pReadr, &pIncr->aFile[0], pIncr->iStartOff
        );
        bEof = 0;
      }
    }

    if( bEof ){
      /* This is an EOF condition */
      vdbePmaReaderClear(pReadr);
      testcase( rc!=SQLITE_OK );
      return rc;
    }
  }

  if( rc==SQLITE_OK ){
    rc = vdbePmaReadVarint(pReadr, &nRec);
  }
  if( rc==SQLITE_OK ){
    pReadr->nKey = (int)nRec;
    rc = vdbePmaReadBlob(pReadr, (int)nRec, &pReadr->aKey);
    testcase( rc!=SQLITE_OK );
  }

  return rc;
}